

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesLedSetColor(zes_led_handle_t hLed,zes_led_color_t *pColor)

{
  zes_pfnLedSetColor_t pfnSetColor;
  dditable_t *dditable;
  ze_result_t result;
  zes_led_color_t *pColor_local;
  zes_led_handle_t hLed_local;
  
  if (*(code **)(*(long *)(hLed + 8) + 0xc90) == (code *)0x0) {
    hLed_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hLed_local._4_4_ = (**(code **)(*(long *)(hLed + 8) + 0xc90))(*(undefined8 *)hLed,pColor);
  }
  return hLed_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesLedSetColor(
        zes_led_handle_t hLed,                          ///< [in] Handle for the component.
        const zes_led_color_t* pColor                   ///< [in] New color of the LED.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_led_object_t*>( hLed )->dditable;
        auto pfnSetColor = dditable->zes.Led.pfnSetColor;
        if( nullptr == pfnSetColor )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hLed = reinterpret_cast<zes_led_object_t*>( hLed )->handle;

        // forward to device-driver
        result = pfnSetColor( hLed, pColor );

        return result;
    }